

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O3

string * GetNearestAirportId_abi_cxx11_
                   (string *__return_storage_ptr__,positionTy *_pos,positionTy *outApPos)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_t sVar3;
  float lon;
  float lat;
  float alt;
  char airportId [33];
  float local_44;
  float local_40;
  float local_3c;
  char local_38 [40];
  
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0x18] = '\0';
  local_38[0x19] = '\0';
  local_38[0x1a] = '\0';
  local_38[0x1b] = '\0';
  local_38[0x1c] = '\0';
  local_38[0x1d] = '\0';
  local_38[0x1e] = '\0';
  local_38[0x1f] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x20] = 0;
  local_40 = (float)_pos->_lat;
  local_44 = (float)_pos->_lon;
  iVar2 = XPLMFindNavAid(0,0,&local_40,&local_44,0,1);
  if (iVar2 != 0) {
    local_3c = 0.0;
    XPLMGetNavAidInfo(iVar2,0,&local_40,&local_44,&local_3c,0,0,local_38,0,0);
    if (outApPos != (positionTy *)0x0) {
      auVar1._8_4_ = SUB84((double)local_44,0);
      auVar1._0_8_ = (double)local_40;
      auVar1._12_4_ = (int)((ulong)(double)local_44 >> 0x20);
      outApPos->_lat = (double)local_40;
      outApPos->_lon = (double)auVar1._8_8_;
      outApPos->_alt = (double)local_3c;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_38,local_38 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string GetNearestAirportId (const positionTy& _pos,
                                 positionTy* outApPos)
{
    char airportId[33] = "";

    // Find the nearest airport
    float lat = (float)_pos.lat();
    float lon = (float)_pos.lon();
    XPLMNavRef navRef = XPLMFindNavAid(nullptr, nullptr,
                                       &lat, &lon, nullptr,
                                       xplm_Nav_Airport);
    if (navRef) {
        // fetch airport info
        float alt = 0.0f;
        XPLMGetNavAidInfo(navRef, nullptr, &lat, &lon, &alt, nullptr, nullptr,
                          airportId, nullptr, nullptr);
        // fill output structure
        if (outApPos) {
            outApPos->lat() = lat;
            outApPos->lon() = lon;
            outApPos->alt_m() = alt;
        }
    }
    
    // return the id
    return airportId;
}